

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

int linear_expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar9 = *e;
  dVar11 = *f;
  bVar7 = dVar9 < dVar11 == dVar11 <= -dVar9;
  if (bVar7) {
    dVar10 = f[1];
    dVar8 = dVar11;
  }
  else {
    dVar8 = dVar9;
    dVar9 = e[1];
    dVar10 = dVar11;
  }
  uVar6 = (ulong)!bVar7;
  uVar4 = (ulong)bVar7;
  uVar1 = (uint)!bVar7;
  if (((int)uVar1 < elen) && ((flen <= (int)(uint)bVar7 || (dVar9 < dVar10 != dVar10 <= -dVar9)))) {
    dVar11 = dVar9 + dVar8;
    dVar12 = dVar11 - dVar9;
    uVar6 = (ulong)(uVar1 + 1);
    dVar9 = e[uVar6];
  }
  else {
    dVar11 = dVar10 + dVar8;
    dVar12 = dVar11 - dVar10;
    uVar4 = (ulong)(bVar7 + 1);
    dVar10 = f[uVar4];
  }
  dVar8 = dVar8 - dVar12;
  uVar1 = (elen + flen) - 2;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    dVar12 = dVar11;
    do {
      iVar5 = (int)uVar6;
      iVar3 = (int)uVar4;
      if ((iVar5 < elen) && ((flen <= iVar3 || (dVar9 < dVar10 != dVar10 <= -dVar9)))) {
        dVar13 = dVar8 + dVar9;
        h[uVar2] = dVar8 - (dVar13 - dVar9);
        uVar6 = (ulong)(iVar5 + 1);
        dVar9 = e[(long)iVar5 + 1];
      }
      else {
        dVar13 = dVar8 + dVar10;
        h[uVar2] = dVar8 - (dVar13 - dVar10);
        uVar4 = (ulong)(iVar3 + 1);
        dVar10 = f[(long)iVar3 + 1];
      }
      dVar11 = dVar12 + dVar13;
      dVar8 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar13 - (dVar11 - dVar12));
      uVar2 = uVar2 + 1;
      dVar12 = dVar11;
    } while (uVar1 != uVar2);
  }
  h[uVar2 & 0xffffffff] = dVar8;
  h[(uVar2 & 0xffffffff) + 1] = dVar11;
  return (int)uVar2 + 2;
}

Assistant:

int linear_expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q, q;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (hindex = 0; hindex < elen + flen - 2; hindex++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, h[hindex]);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, h[hindex]);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
  }
  h[hindex] = q;
  h[hindex + 1] = Q;
  return hindex + 2;
}